

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidCustomMultipleWeights(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  CustomLayerParams *this_01;
  WeightParams *this_02;
  ostream *poVar5;
  undefined1 local_c0 [8];
  Result res;
  WeightParams *weights2;
  WeightParams *weights;
  CustomLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outvec;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_DOUBLE);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,0xc);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar4,ArrayFeatureType_ArrayDataType_DOUBLE);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_custom(this_00);
  CoreML::Specification::CustomLayerParams::set_classname(this_01,"CustomClassName");
  this_02 = CoreML::Specification::CustomLayerParams::add_weights(this_01);
  CoreML::Specification::WeightParams::set_float16value(this_02,"somebitshere");
  res.m_message.field_2._8_8_ = CoreML::Specification::CustomLayerParams::add_weights(this_01);
  CoreML::Specification::WeightParams::set_float16value
            ((WeightParams *)res.m_message.field_2._8_8_,"bitsbits");
  CoreML::Specification::WeightParams::set_rawvalue
            ((WeightParams *)res.m_message.field_2._8_8_,"morebits");
  CoreML::validate<(MLModelType)500>((Result *)local_c0,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_c0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xfc8);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_c0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidCustomMultipleWeights() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_custom();

    params->set_classname("CustomClassName");

    auto *weights = params->add_weights();
    weights->set_float16value("somebitshere");

    auto *weights2 = params->add_weights();
    weights2->set_float16value("bitsbits");
    weights2->set_rawvalue("morebits");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}